

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void prt_binary(bitflag *flags,wchar_t offset,wchar_t row,wchar_t col,wchar_t ch,wchar_t num)

{
  _Bool _Var1;
  wchar_t c;
  wchar_t a;
  int flag;
  
  for (flag = 1; flag != 0x2d; flag = flag + 1) {
    _Var1 = flag_has_dbg(flags,6,flag,"flags","flag");
    if (_Var1) {
      a = L'\x06';
      c = row;
    }
    else {
      a = L'\x01';
      c = L'-';
    }
    Term_putch(flag + L'\xffffffff',offset,a,c);
  }
  return;
}

Assistant:

static void prt_binary(const bitflag *flags, int offset, int row, int col,
	wchar_t ch, int num)
{
	int flag;

	/* Scan the flags. */
	for (flag = FLAG_START + offset; flag < FLAG_START + offset + num; flag++) {
		if (of_has(flags, flag)) {
			Term_putch(col++, row, COLOUR_BLUE, ch);
		} else {
			Term_putch(col++, row, COLOUR_WHITE, L'-');
		}
	}
}